

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demo6502.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  DemoM6502 local_38e0;
  
  DemoM6502::DemoM6502(&local_38e0);
  local_38e0.super_PixelGameEngine.bPixelCohesion = false;
  local_38e0.super_PixelGameEngine.vScreenSize.x = 0x30c;
  local_38e0.super_PixelGameEngine.vScreenSize.y = 0x1e0;
  local_38e0.super_PixelGameEngine.vInvScreenSize.x = 0.0012820513;
  local_38e0.super_PixelGameEngine.vInvScreenSize.y = 0.0020833334;
  local_38e0.super_PixelGameEngine.vPixelSize.x = 2;
  local_38e0.super_PixelGameEngine.vPixelSize.y = 2;
  local_38e0.super_PixelGameEngine.vWindowSize.x = 0x618;
  local_38e0.super_PixelGameEngine.vWindowSize.y = 0x3c0;
  local_38e0.super_PixelGameEngine.bFullScreen = false;
  local_38e0.super_PixelGameEngine.bEnableVSYNC = false;
  local_38e0.super_PixelGameEngine.vPixel.x = 0.0;
  local_38e0.super_PixelGameEngine.vPixel.y = 0.0;
  olc::PixelGameEngine::Start(&local_38e0.super_PixelGameEngine);
  local_38e0.super_PixelGameEngine._vptr_PixelGameEngine = (_func_int **)&PTR__DemoM6502_00130a08;
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_38e0.mapAsm._M_t);
  Bus::~Bus(&local_38e0.nes);
  if (local_38e0.cart.super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38e0.cart.super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  olc::PixelGameEngine::~PixelGameEngine(&local_38e0.super_PixelGameEngine);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
  DemoM6502 demo;
  demo.Construct(780, 480, 2, 2);
  demo.Start();
  return 0;
}